

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O1

void ansv<unsigned_long,2,0,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  _Map_pointer pppVar5;
  _Map_pointer pppVar6;
  comm *comm_00;
  unsigned_long uVar7;
  long *plVar8;
  _Elt_pointer ppVar9;
  _Elt_pointer ppVar10;
  _Elt_pointer ppVar11;
  _Elt_pointer ppVar12;
  unsigned_long *puVar13;
  long lVar14;
  ulong uVar15;
  _Elt_pointer ppVar16;
  long lVar17;
  _Elt_pointer ppVar18;
  unsigned_long uVar19;
  unsigned_long uVar20;
  unsigned_long uVar21;
  ulong uVar22;
  _Elt_pointer ppVar23;
  ulong uVar24;
  ulong uVar25;
  _Elt_pointer ppVar26;
  _Elt_pointer ppVar27;
  long lVar28;
  ulong *puVar29;
  ulong uVar30;
  _Elt_pointer ppVar31;
  pair<unsigned_long,_unsigned_long> *ppVar32;
  _Elt_pointer ppVar33;
  pointer puVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  comm *pcVar38;
  _Elt_pointer ppVar39;
  bool bVar40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1e8;
  _Elt_pointer local_198;
  _Elt_pointer local_190;
  _Elt_pointer local_188;
  comm *local_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_178;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  _Elt_pointer local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_140;
  pair<unsigned_long,_unsigned_long> local_138;
  _Elt_pointer local_128;
  unsigned_long local_120;
  unsigned_long local_118;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_110;
  size_type local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Elt_pointer local_90;
  _Elt_pointer local_88;
  _Elt_pointer local_80;
  long local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_70;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_50;
  
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_170 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_140 = right_nsv;
  local_120 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1e8,0);
  local_f8 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  local_180 = comm;
  uVar7 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_f8,comm);
  lVar28 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_178 = in;
  if (lVar28 != 0) {
    lVar28 = lVar28 >> 3;
LAB_0012fef8:
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar9 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if ((local_178->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar28 + -1] < ppVar9[-1].first) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0012fef8;
        }
      }
      while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar9 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if ((local_178->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar28 + -1] != ppVar9[-1].first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((uVar7 - 1) + lVar28);
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(local_178->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar28 + -1];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar28 = lVar28 + -1;
    } while (lVar28 != 0);
  }
  local_50.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_70.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_70.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_168,&local_50,&local_70,(allocator_type *)&local_a8);
  pvVar2 = *(void **)local_170;
  *(pointer *)local_170 =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_170 + 8) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_170 + 0x10) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
  }
  if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar6 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar5 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_198 = (_Elt_pointer)
              (((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)((_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Elt_pointer)0x0)) * 0x20);
  local_188 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar9 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  pvVar4 = local_178;
  if (local_198 == (_Elt_pointer)0x0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 0, indexing_type = 0]"
                 );
  }
  for (; local_178 = pvVar4, ppVar9 < pppVar6; ppVar9 = (_Elt_pointer)&ppVar9->second) {
    operator_delete((void *)ppVar9->second);
    pvVar4 = local_178;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar5;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_188;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_190;
  if ((pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar37 = 0;
LAB_001301ab:
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar9 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if ((pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar37] < ppVar9[-1].first) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_001301ab;
        }
      }
      while (lVar28 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4,
            1 < ((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) + lVar28 +
                ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)((_Elt_pointer)
                             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Elt_pointer)0x0)) * 0x20) {
        ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar9 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        uVar19 = (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start[uVar37];
        if (uVar19 != ppVar9[-1].first) break;
        uVar22 = lVar28 - 1;
        if (uVar22 < 0x20) {
          ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          ppVar10 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        }
        else {
          uVar15 = uVar22 >> 5 | 0xf800000000000000;
          if (1 < lVar28) {
            uVar15 = uVar22 >> 5;
          }
          ppVar10 = (_Elt_pointer)
                    ((unsigned_long *)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                    uVar15);
          ppVar12 = (_Elt_pointer)ppVar10->first;
          ppVar9 = ppVar12 + uVar22 + uVar15 * -0x20;
        }
        if (ppVar9 == ppVar12) {
          ppVar9 = (_Elt_pointer)(ppVar10[-1].second + 0x200);
        }
        if (uVar19 != ppVar9[-1].first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar37 + uVar7);
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar37];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < (ulong)((long)(pvVar4->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar4->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar37 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar40 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
           (_Elt_pointer)0x0;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_150 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_90 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_170,*(undefined8 *)(local_170 + 8));
  pppVar6 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar5 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar28 = (long)ppVar9 - (long)local_190;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_118 = (local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar28 = (lVar28 >> 4) + ((long)ppVar10 - (long)ppVar12 >> 4) +
           (((uVar37 >> 3) - 1) + (ulong)bVar40) * 0x20;
  ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_128 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar9 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  pcVar38 = local_180;
  if (lVar28 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 0, indexing_type = 0]"
                 );
  }
  for (; local_188 = ppVar10, local_180 = pcVar38, ppVar9 < pppVar6;
      ppVar9 = (_Elt_pointer)&ppVar9->second) {
    operator_delete((void *)ppVar9->second);
    ppVar10 = local_188;
    pcVar38 = local_180;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar5;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_190;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_188;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_128;
  if (lVar28 + (long)local_198 != *(long *)(local_170 + 8) - *(long *)local_170 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 0, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_168,&local_118,1,pcVar38);
  local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a8,(long)pcVar38->m_size,(value_type_conflict *)&local_c0,
             (allocator_type *)&local_f0);
  local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c0,(long)pcVar38->m_size,(value_type_conflict *)&local_f0,
             (allocator_type *)&local_d8);
  comm_00 = local_180;
  iVar1 = pcVar38->m_rank;
  lVar28 = (long)iVar1;
  if (0 < lVar28) {
    uVar37 = *(ulong *)((long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar28 * 8 + -8);
    lVar14 = lVar28;
    uVar19 = 0;
    do {
      lVar17 = lVar14 + -1;
      ppVar9 = (_Elt_pointer)(uVar19 + 1);
      if (uVar19 + 1 < local_198) {
        ppVar9 = local_198;
      }
      puVar29 = (ulong *)(uVar19 * 0x10 + *(long *)local_170);
      uVar20 = uVar19 - 1;
      do {
        uVar21 = (long)ppVar9 - 1;
        if ((1 - (long)ppVar9) + uVar20 == -1) break;
        uVar22 = *puVar29;
        uVar21 = uVar20 + 1;
        puVar29 = puVar29 + 2;
        uVar20 = uVar21;
      } while (*(ulong *)((long)local_168.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar17 * 8) <= uVar22);
      uVar22 = *(ulong *)((long)local_168.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar17 * 8);
      iVar35 = 0x12;
      if (uVar22 <= uVar37) {
        *(unsigned_long *)
         ((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar17 * 8) = (uVar21 - uVar19) + 1;
        *(unsigned_long *)
         ((long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar17 * 8) = uVar19;
        iVar35 = (uint)(*(ulong *)((long)local_168.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar17 * 8) <
                       local_118) << 4;
        uVar37 = uVar22;
      }
    } while (((iVar35 == 0x12) || (iVar35 == 0)) &&
            (bVar40 = 1 < lVar14, lVar14 = lVar17, uVar19 = uVar21, bVar40));
  }
  iVar35 = local_180->m_size;
  if ((iVar1 < iVar35 + -1) && (iVar1 + 1 < iVar35)) {
    lVar14 = *(long *)local_170;
    uVar15 = *(long *)(local_170 + 8) - lVar14 >> 4;
    uVar37 = ((unsigned_long *)
             ((long)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar28];
    local_190 = (_Elt_pointer)
                local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_188 = (_Elt_pointer)
                local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar28 = lVar28 + 1;
    uVar22 = uVar15 - 1;
    iVar36 = iVar1;
    do {
      uVar25 = uVar22;
      if (iVar1 < iVar36) {
        uVar30 = uVar22 + 1;
        if (uVar22 + 1 < uVar15) {
          uVar30 = uVar15;
        }
        puVar29 = (ulong *)(uVar22 * 0x10 + lVar14 + 0x10);
        uVar24 = uVar22 - 1;
        do {
          uVar25 = uVar30 - 1;
          if (uVar15 <= uVar24 + 2) break;
          uVar25 = uVar24 + 1;
          uVar3 = *puVar29;
          puVar29 = puVar29 + 2;
          uVar24 = uVar25;
        } while (uVar3 <= uVar37);
      }
      ppVar9 = (_Elt_pointer)uVar22;
      if (local_198 < uVar22) {
        puVar29 = (ulong *)(uVar22 * 0x10 + lVar14);
        do {
          ppVar9 = (_Elt_pointer)uVar22;
          if (*puVar29 <
              local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar28]) break;
          uVar22 = uVar22 - 1;
          puVar29 = puVar29 + -2;
          ppVar9 = local_198;
        } while (local_198 < uVar22);
      }
      uVar22 = local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar28];
      iVar36 = 0x17;
      if (uVar22 <= uVar37) {
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar28] = (uVar25 - (long)ppVar9) + 1;
        local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar28] = (unsigned_long)ppVar9;
        uVar37 = uVar22;
        iVar36 = 0;
        if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar28] < local_118) {
          iVar36 = 0x15;
        }
      }
      if ((iVar36 != 0x17) && (iVar36 != 0)) break;
      iVar36 = (int)lVar28;
      lVar28 = lVar28 + 1;
      uVar22 = (ulong)ppVar9;
    } while (iVar35 != (int)lVar28);
  }
  mxx::all2all<unsigned_long>(&local_f0,&local_a8,local_180);
  mxx::impl::get_displacements<unsigned_long>(&local_d8,&local_f0);
  local_80 = (_Elt_pointer)
             (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] +
             local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_110,(size_type)local_80,(allocator_type *)&local_138);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_170,&local_a8,&local_c0,
             local_110.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f0,&local_d8,comm_00);
  local_190 = (_Elt_pointer)
              local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_00->m_rank];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_140,local_f8);
  pppVar6 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar5 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_198 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_180 = (comm *)local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  for (ppVar9 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
      ppVar9 < pppVar6; ppVar9 = (_Elt_pointer)&ppVar9->second) {
    operator_delete((void *)ppVar9->second);
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar10;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar5;
  lVar28 = (long)(local_178->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_178->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_198;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)local_180;
  if (lVar28 != 0) {
    lVar28 = lVar28 >> 3;
    local_188 = (_Elt_pointer)(uVar7 - 1);
    do {
      local_198 = (_Elt_pointer)((long)local_188 + lVar28);
      lVar28 = lVar28 + -1;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_180 = (comm *)(local_178->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start;
        do {
          ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar9 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          if (ppVar9[-1].first <= *(ulong *)((long)local_180 + lVar28 * 8)) break;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar19 = ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[*(long *)(uVar19 + 0x1f8) - uVar7] =
                 (unsigned_long)local_198;
            ppVar9 = (_Elt_pointer)(uVar19 + 0x200);
          }
          else {
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar7] =
                 (unsigned_long)local_198;
            ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar19 = ppVar9[-1].first;
          uVar20 = ppVar9[-1].second;
          while( true ) {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar9 = (_Elt_pointer)
                       (((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second + 0x200);
            }
            if (uVar19 != ppVar9[-1].first) break;
            ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar9 = (_Elt_pointer)
                       (((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second + 0x200);
            }
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar9[-1].second - uVar7] = uVar20;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_138.first =
           (local_178->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar28];
      local_138.second = (unsigned_long)local_198;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_138);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_138.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)local_198;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar28 != 0);
  }
  if (local_190 != (_Elt_pointer)0x0) {
    local_88 = (_Elt_pointer)((long)&local_190[-1].second + 7);
    local_78 = (long)local_190 * 0x10 + -0x10;
    ppVar9 = (_Elt_pointer)0x0;
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      local_188 = (_Elt_pointer)((long)&local_190->first + ~(ulong)ppVar9);
      local_128 = (_Elt_pointer)((long)local_188 * 0x10);
      local_198 = (_Elt_pointer)
                  local_110.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)local_188].second;
      ppVar32 = local_110.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)local_188;
      local_180 = (comm *)ppVar9;
      do {
        ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar9 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if (ppVar9[-1].first <= ppVar32->first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          uVar19 = ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[*(long *)(uVar19 + 0x1f8) - uVar7] =
               (unsigned_long)local_198;
          ppVar9 = (_Elt_pointer)(uVar19 + 0x200);
        }
        else {
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar7] =
               (unsigned_long)local_198;
          ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        uVar19 = ppVar9[-1].first;
        uVar20 = ppVar9[-1].second;
        while( true ) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
          ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar9 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          if (uVar19 != ppVar9[-1].first) break;
          ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar9 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar9[-1].second - uVar7] = uVar20;
        }
      } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      pcVar38 = local_180;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar9 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if (*(unsigned_long *)
             ((long)&local_128->first +
             (long)&(local_110.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar9[-1].first) {
          ppVar9 = local_188;
          if (local_188 != (_Elt_pointer)0x0) {
            plVar8 = (long *)((long)&local_110.
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-(long)local_180].
                                     first + local_78);
            do {
              if (*plVar8 != plVar8[-2]) goto LAB_00130c51;
              pcVar38 = (comm *)((long)&((_Elt_pointer)pcVar38)->first + 1);
              plVar8 = plVar8 + -2;
              ppVar9 = (_Elt_pointer)((long)ppVar9 + -1);
            } while (ppVar9 != (_Elt_pointer)0x0);
            ppVar9 = (_Elt_pointer)0x0;
            pcVar38 = (comm *)local_88;
          }
LAB_00130c51:
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
            do {
              ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar10 = (_Elt_pointer)
                          (((_Elt_pointer)
                           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10
                           ))->second + 0x200);
              }
              if (ppVar10[-1].first !=
                  local_110.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)ppVar9].first) break;
              if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start
                [*(long *)(((_Elt_pointer)
                           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10
                           ))->second + 0x1f8) - uVar7] =
                     local_110.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)ppVar9].second;
                operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     (_Elt_pointer)
                     ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     (_Map_pointer)
                     &((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
              }
              else {
                (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start
                [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar7] =
                     local_110.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)ppVar9].second;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                     local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
          }
        }
      }
      ppVar9 = (_Elt_pointer)((long)&((_Elt_pointer)pcVar38)->first + 1);
    } while (ppVar9 < local_190);
  }
  pppVar5 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_188 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_180 = (comm *)(left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        )._M_impl.super__Vector_impl_data._M_start;
    ppVar11 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar39 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar26 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      puVar34 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_198 = ppVar11;
      ppVar18 = ppVar39;
      ppVar27 = ppVar26;
      while( true ) {
        lVar28 = (long)ppVar18 - (long)ppVar27 >> 4;
        uVar37 = lVar28 - 1;
        if (uVar37 < 0x20) {
          ppVar23 = ppVar18 + -1;
        }
        else {
          uVar22 = uVar37 >> 5 | 0xf800000000000000;
          if (1 < lVar28) {
            uVar22 = uVar37 >> 5;
          }
          ppVar23 = (_Elt_pointer)((uVar37 + uVar22 * -0x20) * 0x10 + (&local_198->first)[uVar22]);
        }
        if (ppVar23 == local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        ppVar23 = ppVar39;
        if (ppVar39 == ppVar26) {
          ppVar23 = (_Elt_pointer)(ppVar11[-1].second + 0x200);
        }
        if (uVar37 < 0x20) {
          ppVar31 = ppVar18 + -1;
          ppVar16 = ppVar27;
          ppVar33 = local_198;
        }
        else {
          uVar22 = uVar37 >> 5 | 0xf800000000000000;
          if (1 < lVar28) {
            uVar22 = uVar37 >> 5;
          }
          ppVar33 = (_Elt_pointer)(&local_198->first + uVar22);
          ppVar16 = (_Elt_pointer)ppVar33->first;
          ppVar31 = ppVar16 + uVar37 + uVar22 * -0x20;
        }
        if (ppVar31 == ppVar16) {
          ppVar31 = (_Elt_pointer)(ppVar33[-1].second + 0x200);
        }
        if (ppVar23[-1].first != ppVar31[-1].first) break;
        if (ppVar18 == ppVar27) {
          ppVar27 = (_Elt_pointer)local_198[-1].second;
          local_198 = (_Elt_pointer)&local_198[-1].second;
          ppVar18 = ppVar27 + 0x20;
        }
        ppVar23 = ppVar39;
        if (ppVar39 == ppVar26) {
          ppVar23 = (_Elt_pointer)(ppVar11[-1].second + 0x200);
        }
        ppVar18 = ppVar18 + -1;
        ppVar31 = ppVar18;
        if (ppVar18 == ppVar27) {
          ppVar31 = (_Elt_pointer)(local_198[-1].second + 0x200);
        }
        puVar34[ppVar31[-1].second - uVar7] = ppVar23[-1].second;
      }
      if (ppVar39 == ppVar26) {
        ppVar39 = (_Elt_pointer)(ppVar11[-1].second + 0x200);
      }
      *(unsigned_long *)((long)local_180 + (ppVar39[-1].second - uVar7) * 8) = local_120;
      if (ppVar18 == ppVar27) {
        ppVar27 = (_Elt_pointer)local_198[-1].second;
        local_198 = (_Elt_pointer)&local_198[-1].second;
        ppVar18 = ppVar27 + 0x20;
      }
      ppVar39 = ppVar18 + -1;
      ppVar11 = local_198;
      ppVar26 = ppVar27;
    } while (ppVar39 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  ppVar11 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_1e8._M_impl.super__Deque_impl_data._M_start._M_node <
      local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node) {
    do {
      puVar13 = &ppVar11->second;
      operator_delete((void *)ppVar11->second);
      ppVar11 = (_Elt_pointer)puVar13;
    } while (puVar13 < local_188);
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar10;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar5;
  puVar34 = (local_178->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_178->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar34) {
    uVar37 = 0;
    do {
      ppVar9 = (_Elt_pointer)(uVar37 + uVar7);
      while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar10 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if (ppVar10[-1].first <= puVar34[uVar37]) break;
        ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar10 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        (local_140->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar10[-1].second - uVar7] = (unsigned_long)ppVar9;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_138.first =
           (local_178->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar37];
      local_138.second = (unsigned_long)ppVar9;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_138);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_138.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = (unsigned_long)ppVar9;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar37 = uVar37 + 1;
      puVar34 = (local_178->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar37 < (ulong)((long)(local_178->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar34 >> 3
                             ));
  }
  if (local_80 != local_190) {
    lVar14 = (long)local_80 - (long)local_190;
    lVar28 = 0;
    local_190 = (_Elt_pointer)((long)local_190 << 4);
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar13 = &(local_110.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first;
      ppVar9 = local_190 + lVar28;
      uVar19 = *(unsigned_long *)((long)&local_190[lVar28].second + (long)puVar13);
      do {
        ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar10 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if (ppVar10[-1].first <= *(ulong *)((long)&ppVar9->first + (long)puVar13)) break;
        ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar10 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        (local_140->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar10[-1].second - uVar7] = uVar19;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      lVar28 = lVar28 + 1;
    } while (lVar28 != lVar14 + (ulong)(lVar14 == 0));
  }
  if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar34 = (local_140->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
    ppVar12 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar9 == ppVar10) {
        puVar34[*(long *)(ppVar12[-1].second + 0x1f8) - uVar7] = local_120;
        ppVar10 = (_Elt_pointer)ppVar12[-1].second;
        ppVar12 = (_Elt_pointer)&ppVar12[-1].second;
        ppVar9 = ppVar10 + 0x20;
      }
      else {
        puVar34[ppVar9[-1].second - uVar7] = local_120;
      }
      ppVar9 = ppVar9 + -1;
    } while (ppVar9 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_170,&local_110);
  if (local_110.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_110.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1e8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}